

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O0

visplane_t * swrenderer::new_visplane(uint hash)

{
  visplane_t *local_18;
  visplane_t *check;
  uint hash_local;
  
  local_18 = freetail;
  if (freetail == (visplane_t *)0x0) {
    local_18 = (visplane_t *)
               M_Malloc_Dbg(0x5ae3,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_plane.cpp"
                            ,0x159);
    memset(local_18,0,0x5ae3);
    local_18->bottom = (unsigned_short *)((long)&local_18[0x34].height.normal.Y + 6);
  }
  else {
    freetail = freetail->next;
    if (freetail == (visplane_t *)0x0) {
      freehead = (undefined *)&freetail;
    }
  }
  local_18->next = *(visplane_s **)(visplanes + (ulong)hash * 8);
  *(visplane_t **)(visplanes + (ulong)hash * 8) = local_18;
  return local_18;
}

Assistant:

static visplane_t *new_visplane (unsigned hash)
{
	visplane_t *check = freetail;

	if (check == NULL)
	{
		check = (visplane_t *)M_Malloc (sizeof(*check) + 3 + sizeof(*check->top)*(MAXWIDTH*2));
		memset(check, 0, sizeof(*check) + 3 + sizeof(*check->top)*(MAXWIDTH*2));
		check->bottom = check->top + MAXWIDTH+2;
	}
	else if (NULL == (freetail = freetail->next))
	{
		freehead = &freetail;
	}

	check->next = visplanes[hash];
	visplanes[hash] = check;
	return check;
}